

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcRobustBufferAccessBehaviorTests.cpp
# Opt level: O0

void deqp::RobustBufferAccessBehavior::Texture::CompressedImage
               (Functions *gl,GLenum target,GLint level,GLenum internal_format,GLuint width,
               GLuint height,GLuint depth,GLsizei image_size,GLvoid *data)

{
  GLenum GVar1;
  TestError *this;
  GLuint height_local;
  GLuint width_local;
  GLenum internal_format_local;
  GLint level_local;
  GLenum target_local;
  Functions *gl_local;
  
  if (target == 0xde0) {
    (*gl->compressedTexImage1D)(0xde0,level,internal_format,width,0,image_size,data);
    GVar1 = (*gl->getError)();
    glu::checkError(GVar1,"CompressedTexImage1D",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0x2a2);
    return;
  }
  if (target != 0xde1) {
    if (target == 0x806f) {
LAB_0168ce1c:
      (*gl->compressedTexImage3D)(target,level,internal_format,width,height,depth,0,image_size,data)
      ;
      GVar1 = (*gl->getError)();
      glu::checkError(GVar1,"CompressedTexImage3D",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                      ,700);
      return;
    }
    if (target != 0x84f5) {
      if (target == 0x8513) {
        (*gl->compressedTexImage2D)(0x8515,level,internal_format,width,height,0,image_size,data);
        (*gl->compressedTexImage2D)(0x8516,level,internal_format,width,height,0,image_size,data);
        (*gl->compressedTexImage2D)(0x8517,level,internal_format,width,height,0,image_size,data);
        (*gl->compressedTexImage2D)(0x8518,level,internal_format,width,height,0,image_size,data);
        (*gl->compressedTexImage2D)(0x8519,level,internal_format,width,height,0,image_size,data);
        (*gl->compressedTexImage2D)(0x851a,level,internal_format,width,height,0,image_size,data);
        GVar1 = (*gl->getError)();
        glu::checkError(GVar1,"CompressedTexImage2D",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                        ,0x2b7);
        return;
      }
      if (target != 0x8c18) {
        if (target != 0x8c1a) {
          this = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this,"Invliad enum",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                     ,0x2bf);
          __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        goto LAB_0168ce1c;
      }
    }
  }
  (*gl->compressedTexImage2D)(target,level,internal_format,width,height,0,image_size,data);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"CompressedTexImage2D",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                  ,0x2a8);
  return;
}

Assistant:

void Texture::CompressedImage(const glw::Functions& gl, glw::GLenum target, glw::GLint level,
							  glw::GLenum internal_format, glw::GLuint width, glw::GLuint height, glw::GLuint depth,
							  glw::GLsizei image_size, const glw::GLvoid* data)
{
	switch (target)
	{
	case GL_TEXTURE_1D:
		gl.compressedTexImage1D(target, level, internal_format, width, 0 /* border */, image_size, data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "CompressedTexImage1D");
		break;
	case GL_TEXTURE_1D_ARRAY:
	case GL_TEXTURE_2D:
	case GL_TEXTURE_RECTANGLE:
		gl.compressedTexImage2D(target, level, internal_format, width, height, 0 /* border */, image_size, data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "CompressedTexImage2D");
		break;
	case GL_TEXTURE_CUBE_MAP:
		gl.compressedTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X, level, internal_format, width, height, 0 /* border */,
								image_size, data);
		gl.compressedTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_X, level, internal_format, width, height, 0 /* border */,
								image_size, data);
		gl.compressedTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Y, level, internal_format, width, height, 0 /* border */,
								image_size, data);
		gl.compressedTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Y, level, internal_format, width, height, 0 /* border */,
								image_size, data);
		gl.compressedTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Z, level, internal_format, width, height, 0 /* border */,
								image_size, data);
		gl.compressedTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Z, level, internal_format, width, height, 0 /* border */,
								image_size, data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "CompressedTexImage2D");
		break;
	case GL_TEXTURE_3D:
	case GL_TEXTURE_2D_ARRAY:
		gl.compressedTexImage3D(target, level, internal_format, width, height, depth, 0 /* border */, image_size, data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "CompressedTexImage3D");
		break;
	default:
		TCU_FAIL("Invliad enum");
		break;
	}
}